

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error internalEntityProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  OPEN_INTERNAL_ENTITY *pOVar1;
  ENTITY *pEVar2;
  XML_Error XVar3;
  char *end_00;
  char *next;
  char *local_38;
  
  pOVar1 = parser->m_openInternalEntities;
  if (pOVar1 == (OPEN_INTERNAL_ENTITY *)0x0) {
    XVar3 = XML_ERROR_UNEXPECTED_STATE;
  }
  else {
    pEVar2 = pOVar1->entity;
    local_38 = pEVar2->textPtr + pEVar2->processed;
    end_00 = pEVar2->textPtr + pEVar2->textLen;
    XVar3 = doContent(parser,pOVar1->startTagLevel,parser->m_internalEncoding,local_38,end_00,
                      &local_38,'\0',(XML_Account)nextPtr);
    if (XVar3 == XML_ERROR_NONE) {
      if ((end_00 == local_38) || ((parser->m_parsingStatus).parsing != XML_SUSPENDED)) {
        pEVar2->open = '\0';
        parser->m_openInternalEntities = pOVar1->next;
        pOVar1->next = parser->m_freeInternalEntities;
        parser->m_freeInternalEntities = pOVar1;
        parser->m_processor = contentProcessor;
        XVar3 = doContent(parser,(uint)(parser->m_parentParser != (XML_Parser)0x0),
                          parser->m_encoding,s,end,nextPtr,
                          (parser->m_parsingStatus).finalBuffer == '\0',(XML_Account)nextPtr);
      }
      else {
        pEVar2->processed = (int)local_38 - *(int *)&pEVar2->textPtr;
        XVar3 = XML_ERROR_NONE;
      }
    }
  }
  return XVar3;
}

Assistant:

static enum XML_Error PTRCALL
internalEntityProcessor(XML_Parser parser, const char *s, const char *end,
                        const char **nextPtr) {
  ENTITY *entity;
  const char *textStart, *textEnd;
  const char *next;
  enum XML_Error result;
  OPEN_INTERNAL_ENTITY *openEntity = parser->m_openInternalEntities;
  if (! openEntity)
    return XML_ERROR_UNEXPECTED_STATE;

  entity = openEntity->entity;
  textStart = ((const char *)entity->textPtr) + entity->processed;
  textEnd = (const char *)(entity->textPtr + entity->textLen);
  /* Set a safe default value in case 'next' does not get set */
  next = textStart;

#ifdef XML_DTD
  if (entity->is_param) {
    int tok
        = XmlPrologTok(parser->m_internalEncoding, textStart, textEnd, &next);
    result = doProlog(parser, parser->m_internalEncoding, textStart, textEnd,
                      tok, next, &next, XML_FALSE, XML_TRUE,
                      XML_ACCOUNT_ENTITY_EXPANSION);
  } else
#endif /* XML_DTD */
    result = doContent(parser, openEntity->startTagLevel,
                       parser->m_internalEncoding, textStart, textEnd, &next,
                       XML_FALSE, XML_ACCOUNT_ENTITY_EXPANSION);

  if (result != XML_ERROR_NONE)
    return result;
  else if (textEnd != next
           && parser->m_parsingStatus.parsing == XML_SUSPENDED) {
    entity->processed = (int)(next - (const char *)entity->textPtr);
    return result;
  } else {
#ifdef XML_DTD
    entityTrackingOnClose(parser, entity, __LINE__);
#endif
    entity->open = XML_FALSE;
    parser->m_openInternalEntities = openEntity->next;
    /* put openEntity back in list of free instances */
    openEntity->next = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = openEntity;
  }

#ifdef XML_DTD
  if (entity->is_param) {
    int tok;
    parser->m_processor = prologProcessor;
    tok = XmlPrologTok(parser->m_encoding, s, end, &next);
    return doProlog(parser, parser->m_encoding, s, end, tok, next, nextPtr,
                    (XML_Bool)! parser->m_parsingStatus.finalBuffer, XML_TRUE,
                    XML_ACCOUNT_DIRECT);
  } else
#endif /* XML_DTD */
  {
    parser->m_processor = contentProcessor;
    /* see externalEntityContentProcessor vs contentProcessor */
    return doContent(parser, parser->m_parentParser ? 1 : 0, parser->m_encoding,
                     s, end, nextPtr,
                     (XML_Bool)! parser->m_parsingStatus.finalBuffer,
                     XML_ACCOUNT_DIRECT);
  }
}